

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_use_curve448(mbedtls_ecp_group *grp)

{
  size_t sVar1;
  int local_2c;
  undefined1 local_28 [4];
  int ret;
  mbedtls_mpi Ns;
  mbedtls_ecp_group *grp_local;
  
  Ns.p = (mbedtls_mpi_uint *)grp;
  mbedtls_mpi_init((mbedtls_mpi *)local_28);
  local_2c = mbedtls_mpi_read_string((mbedtls_mpi *)(Ns.p + 4),0x10,"98AA");
  if (((((local_2c == 0) &&
        (local_2c = mbedtls_mpi_lset((mbedtls_mpi *)(Ns.p + 1),1), local_2c == 0)) &&
       (local_2c = mbedtls_mpi_shift_l((mbedtls_mpi *)(Ns.p + 1),0xe0), local_2c == 0)) &&
      ((local_2c = mbedtls_mpi_sub_int((mbedtls_mpi *)(Ns.p + 1),(mbedtls_mpi *)(Ns.p + 1),1),
       local_2c == 0 &&
       (local_2c = mbedtls_mpi_shift_l((mbedtls_mpi *)(Ns.p + 1),0xe0), local_2c == 0)))) &&
     (local_2c = mbedtls_mpi_sub_int((mbedtls_mpi *)(Ns.p + 1),(mbedtls_mpi *)(Ns.p + 1),1),
     local_2c == 0)) {
    sVar1 = mbedtls_mpi_bitlen((mbedtls_mpi *)(Ns.p + 1));
    Ns.p[0x16] = sVar1;
    local_2c = mbedtls_mpi_lset((mbedtls_mpi *)(Ns.p + 10),5);
    if ((local_2c == 0) &&
       (local_2c = mbedtls_mpi_lset((mbedtls_mpi *)(Ns.p + 0x10),1), local_2c == 0)) {
      mbedtls_mpi_free((mbedtls_mpi *)(Ns.p + 0xd));
      local_2c = mbedtls_mpi_set_bit((mbedtls_mpi *)(Ns.p + 0x13),0x1be,'\x01');
      if ((local_2c == 0) &&
         ((local_2c = mbedtls_mpi_read_string
                                ((mbedtls_mpi *)local_28,0x10,
                                 "8335DC163BB124B65129C96FDE933D8D723A70AADC873D6D54A7BB0D"),
          local_2c == 0 &&
          (local_2c = mbedtls_mpi_sub_mpi((mbedtls_mpi *)(Ns.p + 0x13),(mbedtls_mpi *)(Ns.p + 0x13),
                                          (mbedtls_mpi *)local_28), local_2c == 0)))) {
        Ns.p[0x17] = 0x1bf;
      }
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_28);
  if (local_2c != 0) {
    mbedtls_ecp_group_free((mbedtls_ecp_group *)Ns.p);
  }
  return local_2c;
}

Assistant:

static int ecp_use_curve448( mbedtls_ecp_group *grp )
{
    mbedtls_mpi Ns;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    mbedtls_mpi_init( &Ns );

    /* Actually ( A + 2 ) / 4 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &grp->A, 16, "98AA" ) );

    /* P = 2^448 - 2^224 - 1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &grp->P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &grp->P, 224 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &grp->P, &grp->P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &grp->P, 224 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &grp->P, &grp->P, 1 ) );
    grp->pbits = mbedtls_mpi_bitlen( &grp->P );

    /* Y intentionally not set, since we use x/z coordinates.
     * This is used as a marker to identify Montgomery curves! */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &grp->G.X, 5 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &grp->G.Z, 1 ) );
    mbedtls_mpi_free( &grp->G.Y );

    /* N = 2^446 - 13818066809895115352007386748515426880336692474882178609894547503885 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( &grp->N, 446, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &Ns, 16,
                                              "8335DC163BB124B65129C96FDE933D8D723A70AADC873D6D54A7BB0D" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &grp->N, &grp->N, &Ns ) );

    /* Actually, the required msb for private keys */
    grp->nbits = 447;

cleanup:
    mbedtls_mpi_free( &Ns );
    if( ret != 0 )
        mbedtls_ecp_group_free( grp );

    return( ret );
}